

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiclock.cpp
# Opt level: O3

bool choosePort<RtMidiOut>(RtMidiOut *rtmidi,char *dir)

{
  uint uVar1;
  ostream *poVar2;
  size_t sVar3;
  string portName;
  uint local_7c;
  long *local_78;
  long local_70;
  long local_68 [2];
  RtMidiOut *local_58;
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = '\0';
  local_7c = 0;
  local_58 = rtmidi;
  uVar1 = (**(code **)(*(long *)rtmidi + 0x10))();
  if (uVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No ",3);
    if (dir == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107090);
    }
    else {
      sVar3 = strlen(dir);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,dir,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," ports available!",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  else {
    if (uVar1 == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nOpening ",9);
      (**(code **)(*(long *)local_58 + 0x18))(&local_78,local_58,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_78,local_70);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
    }
    else {
      local_7c = 0;
      do {
        (**(code **)(*(long *)local_58 + 0x18))((string *)&local_78,local_58,local_7c);
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        if (dir == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107090);
        }
        else {
          sVar3 = strlen(dir);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,dir,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," port #",7);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_50,local_48);
        local_78 = (long *)CONCAT71(local_78._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_78,1);
        local_7c = local_7c + 1;
      } while (local_7c < uVar1);
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nChoose a port number: ",0x17);
        std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
      } while (uVar1 <= local_7c);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"RtMidi Output","");
    (*(code *)**(undefined8 **)local_58)(local_58,local_7c,&local_78);
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return uVar1 != 0;
}

Assistant:

bool choosePort( RT *rtmidi, const char *dir )
{
  std::string portName;
  unsigned int i = 0, nPorts = rtmidi->getPortCount();
  if ( nPorts == 0 ) {
    std::cout << "No " << dir << " ports available!" << std::endl;
    return false;
  }

  if ( nPorts == 1 ) {
    std::cout << "\nOpening " << rtmidi->getPortName() << std::endl;
  }
  else {
    for ( i=0; i<nPorts; i++ ) {
      portName = rtmidi->getPortName(i);
      std::cout << "  " << dir << " port #" << i << ": " << portName << '\n';
    }

    do {
      std::cout << "\nChoose a port number: ";
      std::cin >> i;
    } while ( i >= nPorts );
  }

  std::cout << "\n";
  rtmidi->openPort( i );

  return true;
}